

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

attr_list attr_join_lists(attr_list list1,attr_list list2)

{
  attr_list p_Var1;
  attr_list *pp_Var2;
  attr_list p_Var3;
  
  p_Var3 = list1;
  if (list2 != (attr_list)0x0) {
    p_Var1 = (attr_list)malloc(0x18);
    if ((global_as == (atom_server)0x0) &&
       (global_as = init_atom_server(prefill_atom_cache), init_global_atom_server_first == '\0')) {
      init_global_atom_server_first = '\x01';
    }
    p_Var1->list_of_lists = 1;
    p_Var1->ref_count = 1;
    pp_Var2 = (attr_list *)malloc(0x10);
    (p_Var1->l).lists.lists = pp_Var2;
    (p_Var1->l).lists.sublist_count = 2;
    *pp_Var2 = list1;
    list1->ref_count = list1->ref_count + 1;
    pp_Var2[1] = list2;
    p_Var3 = list2;
    list1 = p_Var1;
  }
  p_Var3->ref_count = p_Var3->ref_count + 1;
  return list1;
}

Assistant:

extern attr_list
attr_join_lists(attr_list list1, attr_list list2)
{
    attr_list list;

    if (list2 == NULL) {
        list1->ref_count++;
        return list1;
    }
    list = malloc(sizeof(attr_list_struct));

    init_global_atom_server(&global_as);
    list->list_of_lists = 1;
    list->ref_count = 1;
    list->l.lists.lists = (attr_list *)malloc(sizeof(attr_list) *2);
    list->l.lists.sublist_count = 2;
    list->l.lists.lists[0] = list1;
    list1->ref_count++;
    list->l.lists.lists[1] = list2;
    list2->ref_count++;
    return list;     
}